

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c07b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c07b7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c07a0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c07a8 = 0x2e2e2e2e2e2e2e;
    DAT_001c07af = 0x2e;
    _DAT_001c0790 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0798 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c0780 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0788 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0778 = 0x2e2e2e2e2e2e2e2e;
    DAT_001c07bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }